

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O3

string * __thiscall
glcts::GeometryShaderGetProgramiv3Test::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderGetProgramiv3Test *this,_run *run)

{
  ostream *poVar1;
  char *this_00;
  GeometryShaderGetProgramiv3Test *this_01;
  stringstream code_sstream;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(",0x2e);
  getLayoutQualifierForPrimitiveType_abi_cxx11_
            (&local_1c0,(GeometryShaderGetProgramiv3Test *)this_00,run->input_primitive_type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", invocations = ",0x10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,run->invocations);
  this_01 = (GeometryShaderGetProgramiv3Test *)0x1a72ad3;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") in;\nlayout(",0xd);
  getLayoutQualifierForPrimitiveType_abi_cxx11_(&local_1e0,this_01,run->output_primitive_type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", max_vertices = ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,run->max_vertices);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             ") out;\n\nout gl_PerVertex {\n    vec4 gl_Position;\n};\n\nvoid main()\n{\n    for (int n = 0; n < "
             ,0x5b);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,run->max_vertices);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "; ++n)\n    {\n        gl_Position = vec4(n, 0.0, 0.0, 1.0);\n        EmitVertex();\n    }\n\n    EndPrimitive();\n}\n"
             ,0x6e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderGetProgramiv3Test::getGSCode(const _run& run)
{
	std::stringstream code_sstream;

	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout("
				 << getLayoutQualifierForPrimitiveType(run.input_primitive_type) << ", "
																					"invocations = "
				 << run.invocations << ") in;\n"
									   "layout("
				 << getLayoutQualifierForPrimitiveType(run.output_primitive_type) << ", "
																					 "max_vertices = "
				 << run.max_vertices << ") out;\n"
										"\n"
										"out gl_PerVertex {\n"
										"    vec4 gl_Position;\n"
										"};\n"
										"\n"
										"void main()\n"
										"{\n"
										"    for (int n = 0; n < "
				 << run.max_vertices << "; ++n)\n"
										"    {\n"
										"        gl_Position = vec4(n, 0.0, 0.0, 1.0);\n"
										"        EmitVertex();\n"
										"    }\n"
										"\n"
										"    EndPrimitive();\n"
										"}\n";

	return code_sstream.str();
}